

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::DecompressZip
               (uchar *dst,unsigned_long *uncompressed_size,uchar *src,unsigned_long src_size)

{
  size_type __n;
  unsigned_long uVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  uchar *puVar5;
  char *stop_1;
  char *s;
  char *t2;
  char *t1;
  int d;
  uchar *stop;
  uchar *t;
  int ret;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  unsigned_long src_size_local;
  uchar *src_local;
  unsigned_long *uncompressed_size_local;
  uchar *dst_local;
  
  tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)src_size;
  if (*uncompressed_size == src_size) {
    memcpy(dst,src,src_size);
    dst_local._7_1_ = true;
  }
  else {
    __n = *uncompressed_size;
    std::allocator<unsigned_char>::allocator(&local_49);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,__n,&local_49);
    std::allocator<unsigned_char>::~allocator(&local_49);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
    iVar2 = mz_uncompress(pvVar3,uncompressed_size,src,
                          (mz_ulong)
                          tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar2 == 0) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
      uVar1 = *uncompressed_size;
      while (stop = pvVar3 + 1, stop < pvVar4 + uVar1) {
        *stop = *pvVar3 + *stop + 0x80;
        pvVar3 = stop;
      }
      t2 = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
      uVar1 = *uncompressed_size;
      stop_1 = (char *)dst;
      s = (char *)(pvVar3 + (*uncompressed_size + 1 >> 1));
      while (stop_1 < dst + uVar1) {
        puVar5 = (uchar *)(stop_1 + 1);
        *stop_1 = *t2;
        if (dst + uVar1 <= puVar5) break;
        stop_1 = stop_1 + 2;
        *puVar5 = *s;
        s = s + 1;
        t2 = t2 + 1;
      }
      dst_local._7_1_ = true;
    }
    else {
      dst_local._7_1_ = false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  }
  return dst_local._7_1_;
}

Assistant:

static bool DecompressZip(unsigned char *dst,
                          unsigned long *uncompressed_size /* inout */,
                          const unsigned char *src, unsigned long src_size) {
  if ((*uncompressed_size) == src_size) {
    // Data is not compressed(Issue 40).
    memcpy(dst, src, src_size);
    return true;
  }
  std::vector<unsigned char> tmpBuf(*uncompressed_size);

#if TINYEXR_USE_MINIZ
  int ret =
      mz_uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  if (MZ_OK != ret) {
    return false;
  }
#elif TINYEXR_USE_STB_ZLIB
  int ret = stbi_zlib_decode_buffer(reinterpret_cast<char*>(&tmpBuf.at(0)),
      *uncompressed_size, reinterpret_cast<const char*>(src), src_size);
  if (ret < 0) {
    return false;
  }
#else
  int ret = uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  if (Z_OK != ret) {
    return false;
  }
#endif

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + (*uncompressed_size);

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (*uncompressed_size + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + (*uncompressed_size);

    for (;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }

  return true;
}